

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool CheckBlock(CBlock *block,BlockValidationState *state,Params *consensusParams,bool fCheckPOW,
               bool fCheckMerkleRoot)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  size_t sVar5;
  byte in_CL;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *tx_1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1_1;
  uint nSigOps;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  uint i;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  TxValidationState tx_state;
  CTransaction *in_stack_fffffffffffffc78;
  undefined6 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc86;
  undefined1 in_stack_fffffffffffffc87;
  CTransaction *in_stack_fffffffffffffc88;
  string *reject_reason;
  undefined8 in_stack_fffffffffffffc90;
  BlockValidationResult BVar6;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffffc98;
  ValidationState<BlockValidationResult> *this;
  CTransaction *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined4 in_stack_fffffffffffffcb8;
  TxValidationResult in_stack_fffffffffffffcbc;
  char *in_stack_fffffffffffffcc0;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  Params *in_stack_fffffffffffffcd0;
  BlockValidationState *in_stack_fffffffffffffcd8;
  CBlockHeader *in_stack_fffffffffffffce0;
  int local_2a0;
  uint local_288;
  undefined5 in_stack_fffffffffffffda8;
  byte in_stack_fffffffffffffdad;
  undefined2 in_stack_fffffffffffffdae;
  CBlock *in_stack_fffffffffffffdb0;
  allocator<char> local_22e;
  allocator<char> local_22d;
  allocator<char> local_22c;
  allocator<char> local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  ParamsWrapper<TransactionSerParams,_const_CBlock> local_228;
  allocator<char> local_212;
  allocator<char> local_211 [17];
  TxValidationState *in_stack_fffffffffffffe00;
  CTransaction *in_stack_fffffffffffffe08;
  char local_150 [328];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    bVar1 = CheckBlockHeader(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                             in_stack_fffffffffffffcd0,(bool)in_stack_fffffffffffffccf);
    if (bVar1) {
      if (((*(byte *)(in_RDX + 0x150) & 1) != 0) && ((in_CL & 1) != 0)) {
        bVar1 = CheckSignetBlockSolution
                          (in_stack_fffffffffffffdb0,
                           (Params *)
                           CONCAT26(in_stack_fffffffffffffdae,
                                    CONCAT15(in_stack_fffffffffffffdad,in_stack_fffffffffffffda8)));
        BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffc90 >> 0x20);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                     in_stack_fffffffffffffcc0,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                     in_stack_fffffffffffffcc0,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          in_stack_fffffffffffffdad =
               ValidationState<BlockValidationResult>::Invalid
                         (in_stack_fffffffffffffc98,BVar6,(string *)in_stack_fffffffffffffc88,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffc87,
                                   CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78);
          std::allocator<char>::~allocator(&local_212);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78);
          std::allocator<char>::~allocator(local_211);
          goto LAB_007d4b14;
        }
      }
      if (((in_R8B & 1) == 0) ||
         (bVar1 = CheckMerkleRoot((CBlock *)in_stack_fffffffffffffcd0,
                                  (BlockValidationState *)
                                  CONCAT17(in_stack_fffffffffffffccf,
                                           CONCAT16(in_stack_fffffffffffffcce,
                                                    in_stack_fffffffffffffcc8))), bVar1)) {
        bVar2 = std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)in_stack_fffffffffffffc88);
        bVar1 = true;
        if (!bVar2) {
          sVar4 = std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_fffffffffffffc78);
          bVar1 = true;
          if (sVar4 << 2 < 0x3d0901) {
            local_228 = TransactionSerParams::operator()
                                  ((TransactionSerParams *)in_stack_fffffffffffffc88,
                                   (CBlock *)
                                   CONCAT17(in_stack_fffffffffffffc87,
                                            CONCAT16(in_stack_fffffffffffffc86,
                                                     in_stack_fffffffffffffc80)));
            sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                              ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)
                               CONCAT17(in_stack_fffffffffffffc87,
                                        CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80
                                                )));
            bVar1 = 4000000 < sVar5 * 4;
          }
        }
        BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffc90 >> 0x20);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                     in_stack_fffffffffffffcc0,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                     in_stack_fffffffffffffcc0,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          in_stack_fffffffffffffdad =
               ValidationState<BlockValidationResult>::Invalid
                         (in_stack_fffffffffffffc98,BVar6,(string *)in_stack_fffffffffffffc88,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffc87,
                                   CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78);
          std::allocator<char>::~allocator(&local_22a);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78);
          std::allocator<char>::~allocator(&local_229);
        }
        else {
          bVar1 = std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           *)in_stack_fffffffffffffc88);
          BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffc90 >> 0x20);
          if (!bVar1) {
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_fffffffffffffc88,
                         CONCAT17(in_stack_fffffffffffffc87,
                                  CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffc78);
            bVar1 = CTransaction::IsCoinBase(in_stack_fffffffffffffc88);
            BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffc90 >> 0x20);
            if (bVar1) {
              for (local_288 = 1;
                  sVar4 = std::
                          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                  *)in_stack_fffffffffffffc78), local_288 < sVar4;
                  local_288 = local_288 + 1) {
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)in_stack_fffffffffffffc88,
                             CONCAT17(in_stack_fffffffffffffc87,
                                      CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80))
                            );
                std::
                __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffc78);
                bVar1 = CTransaction::IsCoinBase(in_stack_fffffffffffffc88);
                BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffc90 >> 0x20);
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffccf,
                                      CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8))
                             ,in_stack_fffffffffffffcc0,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffccf,
                                      CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8))
                             ,in_stack_fffffffffffffcc0,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
                  in_stack_fffffffffffffdad =
                       ValidationState<BlockValidationResult>::Invalid
                                 (in_stack_fffffffffffffc98,BVar6,
                                  (string *)in_stack_fffffffffffffc88,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffc87,
                                           CONCAT16(in_stack_fffffffffffffc86,
                                                    in_stack_fffffffffffffc80)));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc78);
                  std::allocator<char>::~allocator(&local_22e);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc78);
                  std::allocator<char>::~allocator(&local_22d);
                  goto LAB_007d4b14;
                }
              }
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc87,
                                  CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc87,
                                CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
              while (bVar1 = __gnu_cxx::
                             operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                       ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                         *)in_stack_fffffffffffffc88,
                                        (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                         *)CONCAT17(in_stack_fffffffffffffc87,
                                                    CONCAT16(in_stack_fffffffffffffc86,
                                                             in_stack_fffffffffffffc80))),
                    ((bVar1 ^ 0xffU) & 1) != 0) {
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffc78);
                in_stack_fffffffffffffcc0 = local_150;
                TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffffc78)
                ;
                std::
                __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffc88);
                in_stack_fffffffffffffcce =
                     CheckTransaction(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
                if ((bool)in_stack_fffffffffffffcce) {
                  bVar1 = false;
                }
                else {
                  in_stack_fffffffffffffcbc =
                       ValidationState<TxValidationResult>::GetResult
                                 ((ValidationState<TxValidationResult> *)in_stack_fffffffffffffc78);
                  if (in_stack_fffffffffffffcbc != TX_CONSENSUS) {
                    __assert_fail("tx_state.GetResult() == TxValidationResult::TX_CONSENSUS",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                  ,0xfc4,
                                  "bool CheckBlock(const CBlock &, BlockValidationState &, const Consensus::Params &, bool, bool)"
                                 );
                  }
                  args = in_RSI;
                  ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                            ((ValidationState<TxValidationResult> *)
                             CONCAT17(in_stack_fffffffffffffc87,
                                      CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80))
                            );
                  std::
                  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)in_stack_fffffffffffffc78);
                  in_stack_fffffffffffffca8 =
                       (CTransaction *)CTransaction::GetHash(in_stack_fffffffffffffc78);
                  transaction_identifier<false>::ToString_abi_cxx11_
                            ((transaction_identifier<false> *)
                             CONCAT17(in_stack_fffffffffffffc87,
                                      CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80))
                            );
                  ValidationState<TxValidationResult>::GetDebugMessage_abi_cxx11_
                            ((ValidationState<TxValidationResult> *)
                             CONCAT17(in_stack_fffffffffffffc87,
                                      CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80))
                            );
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                             args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffca8);
                  in_stack_fffffffffffffdad =
                       ValidationState<BlockValidationResult>::Invalid
                                 (in_stack_fffffffffffffc98,
                                  (BlockValidationResult)((ulong)in_stack_fffffffffffffc90 >> 0x20),
                                  (string *)in_stack_fffffffffffffc88,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffc87,
                                           CONCAT16(in_stack_fffffffffffffc86,
                                                    in_stack_fffffffffffffc80)));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc78);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc78);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc78);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc78);
                  bVar1 = true;
                }
                TxValidationState::~TxValidationState
                          ((TxValidationState *)in_stack_fffffffffffffc78);
                if (bVar1) goto LAB_007d4b14;
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                              *)in_stack_fffffffffffffc78);
              }
              local_2a0 = 0;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc87,
                                  CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc87,
                                CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
              while (bVar1 = __gnu_cxx::
                             operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                       ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                         *)in_stack_fffffffffffffc88,
                                        (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                         *)CONCAT17(in_stack_fffffffffffffc87,
                                                    CONCAT16(in_stack_fffffffffffffc86,
                                                             in_stack_fffffffffffffc80))),
                    ((bVar1 ^ 0xffU) & 1) != 0) {
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffc78);
                std::
                __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffc88);
                uVar3 = GetLegacySigOpCount(in_stack_fffffffffffffca8);
                local_2a0 = uVar3 + local_2a0;
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                              *)in_stack_fffffffffffffc78);
              }
              if ((uint)(local_2a0 << 2) < 0x13881) {
                if (((in_CL & 1) != 0) && ((in_R8B & 1) != 0)) {
                  *(undefined1 *)(in_RDI + 0x68) = 1;
                }
                in_stack_fffffffffffffdad = 1;
              }
              else {
                this = (ValidationState<BlockValidationResult> *)&stack0xfffffffffffffdaf;
                std::allocator<char>::allocator();
                BVar6 = (BlockValidationResult)((ulong)in_RSI >> 0x20);
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffccf,
                                    CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                           in_stack_fffffffffffffcc0,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
                reject_reason = (string *)&stack0xfffffffffffffdae;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffccf,
                                    CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                           in_stack_fffffffffffffcc0,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
                in_stack_fffffffffffffdad =
                     ValidationState<BlockValidationResult>::Invalid
                               (this,BVar6,reject_reason,
                                (string *)
                                CONCAT17(in_stack_fffffffffffffc87,
                                         CONCAT16(in_stack_fffffffffffffc86,
                                                  in_stack_fffffffffffffc80)));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc78);
                std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdae);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc78);
                std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdaf);
              }
              goto LAB_007d4b14;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                     in_stack_fffffffffffffcc0,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                     in_stack_fffffffffffffcc0,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          in_stack_fffffffffffffdad =
               ValidationState<BlockValidationResult>::Invalid
                         (in_stack_fffffffffffffc98,BVar6,(string *)in_stack_fffffffffffffc88,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffc87,
                                   CONCAT16(in_stack_fffffffffffffc86,in_stack_fffffffffffffc80)));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78);
          std::allocator<char>::~allocator(&local_22c);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78);
          std::allocator<char>::~allocator(&local_22b);
        }
      }
      else {
        in_stack_fffffffffffffdad = 0;
      }
    }
    else {
      in_stack_fffffffffffffdad = 0;
    }
  }
  else {
    in_stack_fffffffffffffdad = 1;
  }
LAB_007d4b14:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_fffffffffffffdad & 1);
}

Assistant:

bool CheckBlock(const CBlock& block, BlockValidationState& state, const Consensus::Params& consensusParams, bool fCheckPOW, bool fCheckMerkleRoot)
{
    // These are checks that are independent of context.

    if (block.fChecked)
        return true;

    // Check that the header is valid (particularly PoW).  This is mostly
    // redundant with the call in AcceptBlockHeader.
    if (!CheckBlockHeader(block, state, consensusParams, fCheckPOW))
        return false;

    // Signet only: check block solution
    if (consensusParams.signet_blocks && fCheckPOW && !CheckSignetBlockSolution(block, consensusParams)) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-signet-blksig", "signet block signature validation failure");
    }

    // Check the merkle root.
    if (fCheckMerkleRoot && !CheckMerkleRoot(block, state)) {
        return false;
    }

    // All potential-corruption validation must be done before we do any
    // transaction validation, as otherwise we may mark the header as invalid
    // because we receive the wrong transactions for it.
    // Note that witness malleability is checked in ContextualCheckBlock, so no
    // checks that use witness data may be performed here.

    // Size limits
    if (block.vtx.empty() || block.vtx.size() * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT || ::GetSerializeSize(TX_NO_WITNESS(block)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT)
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-length", "size limits failed");

    // First transaction must be coinbase, the rest must not be
    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase())
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-missing", "first tx is not coinbase");
    for (unsigned int i = 1; i < block.vtx.size(); i++)
        if (block.vtx[i]->IsCoinBase())
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-multiple", "more than one coinbase");

    // Check transactions
    // Must check for duplicate inputs (see CVE-2018-17144)
    for (const auto& tx : block.vtx) {
        TxValidationState tx_state;
        if (!CheckTransaction(*tx, tx_state)) {
            // CheckBlock() does context-free validation checks. The only
            // possible failures are consensus failures.
            assert(tx_state.GetResult() == TxValidationResult::TX_CONSENSUS);
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, tx_state.GetRejectReason(),
                                 strprintf("Transaction check failed (tx hash %s) %s", tx->GetHash().ToString(), tx_state.GetDebugMessage()));
        }
    }
    unsigned int nSigOps = 0;
    for (const auto& tx : block.vtx)
    {
        nSigOps += GetLegacySigOpCount(*tx);
    }
    if (nSigOps * WITNESS_SCALE_FACTOR > MAX_BLOCK_SIGOPS_COST)
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops", "out-of-bounds SigOpCount");

    if (fCheckPOW && fCheckMerkleRoot)
        block.fChecked = true;

    return true;
}